

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

int rfc5444_writer_register_addrtlvtype
              (rfc5444_writer *writer,rfc5444_writer_tlvtype *type,int msgtype)

{
  rfc5444_writer_message *local_30;
  rfc5444_writer_message *msg;
  int msgtype_local;
  rfc5444_writer_tlvtype *type_local;
  rfc5444_writer *writer_local;
  
  local_30 = (rfc5444_writer_message *)0x0;
  if (writer->_state == RFC5444_WRITER_NONE) {
    if (((msgtype < 0) || (0xff < msgtype)) ||
       (local_30 = _get_message(writer,(uint8_t)msgtype), local_30 != (rfc5444_writer_message *)0x0)
       ) {
      _register_addrtlvtype(writer,local_30,type);
      writer_local._4_4_ = 0;
    }
    else {
      writer_local._4_4_ = -1;
    }
    return writer_local._4_4_;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x120,
                "int rfc5444_writer_register_addrtlvtype(struct rfc5444_writer *, struct rfc5444_writer_tlvtype *, int)"
               );
}

Assistant:

int
rfc5444_writer_register_addrtlvtype(struct rfc5444_writer *writer, struct rfc5444_writer_tlvtype *type, int msgtype) {
  struct rfc5444_writer_message *msg = NULL;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif
  if (msgtype >= 0 && msgtype <= 255) {
    if ((msg = _get_message(writer, msgtype)) == NULL) {
      /* out of memory error ? */
      return -1;
    }
  }

  _register_addrtlvtype(writer, msg, type);
  return 0;
}